

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O3

void qt_span_clip(int count,QT_FT_Span *spans,void *userData)

{
  QClipData *this;
  long lVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  QT_FT_Span *end;
  long in_FS_OFFSET;
  QT_FT_Span *newspans;
  int currentClip;
  QT_FT_Span *local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)((long)userData + 0x10) == 1) {
    lVar1 = *(long *)((long)userData + 8);
    iVar2 = *(int *)(lVar1 + 0x10);
    iVar4 = *(int *)(lVar1 + 0x14);
    if (iVar2 < iVar4 + count) {
      do {
        iVar2 = iVar2 * 2;
      } while (iVar2 < iVar4 + count);
      *(int *)(lVar1 + 0x10) = iVar2;
      pvVar3 = realloc(*(void **)(lVar1 + 0x18),(long)iVar2 << 4);
      *(void **)(lVar1 + 0x18) = pvVar3;
      iVar4 = *(int *)(lVar1 + 0x14);
    }
    else {
      pvVar3 = *(void **)(lVar1 + 0x18);
    }
    memcpy((void *)((long)iVar4 * 0x10 + (long)pvVar3),spans,(long)count << 4);
    *(int *)(lVar1 + 0x14) = *(int *)(lVar1 + 0x14) + count;
  }
  else if (*(int *)((long)userData + 0x10) == 2) {
    this = *(QClipData **)((long)userData + 8);
    QClipData::initialize(this);
    local_3c = 0;
    if (0 < count) {
      end = spans + count;
      local_48 = this->m_spans;
      while( true ) {
        local_48 = local_48 + this->count;
        spans = qt_intersect_spans(*userData,&local_3c,spans,end,&local_48,
                                   this->allocated - this->count);
        this->count = (int)((ulong)((long)local_48 - (long)this->m_spans) >> 4);
        if (end <= spans) break;
        local_48 = (QT_FT_Span *)realloc(this->m_spans,(long)this->allocated << 5);
        this->m_spans = local_48;
        this->allocated = this->allocated << 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_span_clip(int count, const QT_FT_Span *spans, void *userData)
{
    ClipData *clipData = reinterpret_cast<ClipData *>(userData);

//     qDebug() << " qt_span_clip: " << count << clipData->operation;
//     for (int i = 0; i < qMin(count, 10); ++i) {
//         qDebug() << "    " << spans[i].x << spans[i].y << spans[i].len << spans[i].coverage;
//     }

    switch (clipData->operation) {

    case Qt::IntersectClip:
        {
            QClipData *newClip = clipData->newClip;
            newClip->initialize();

            int currentClip = 0;
            const QT_FT_Span *end = spans + count;
            while (spans < end) {
                QT_FT_Span *newspans = newClip->m_spans + newClip->count;
                spans = qt_intersect_spans(clipData->oldClip, &currentClip, spans, end,
                                           &newspans, newClip->allocated - newClip->count);
                newClip->count = newspans - newClip->m_spans;
                if (spans < end) {
                    newClip->m_spans = q_check_ptr((QT_FT_Span *)realloc(newClip->m_spans, newClip->allocated * 2 * sizeof(QT_FT_Span)));
                    newClip->allocated *= 2;
                }
            }
        }
        break;

    case Qt::ReplaceClip:
        clipData->newClip->appendSpans(spans, count);
        break;
    case Qt::NoClip:
        break;
    }
}